

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

void __thiscall
TPZSkylMatrix<double>::AddSameStruct(TPZSkylMatrix<double> *this,TPZSkylMatrix<double> *B,double k)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  long lVar4;
  
  pdVar1 = (this->fStorage).fStore;
  lVar3 = (this->fStorage).fNElements;
  pdVar2 = (B->fStorage).fStore;
  lVar4 = 0;
  if (lVar3 < 1) {
    lVar3 = lVar4;
  }
  for (; lVar3 != lVar4; lVar4 = lVar4 + 1) {
    pdVar1[lVar4] = pdVar2[lVar4] * k + pdVar1[lVar4];
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::AddSameStruct(TPZSkylMatrix<TVar> &B, double k){
#ifdef PZDEBUG
	{
		int64_t size = this->fElem.NElements();
		if(size != B.fElem.NElements()){
			PZError << "\nFATAL ERROR at " << __PRETTY_FUNCTION__ << "\n";
			PZError.flush();
			DebugStop();
		}
		for(int64_t i = 0; i < size; i++){
			if((this->fElem[i]-this->fElem[0]) != (B.fElem[i]-B.fElem[0])){
				PZError << "\nFATAL ERROR at " << __PRETTY_FUNCTION__ << "\n";
				PZError.flush();
				DebugStop();
			}
		}
	}
#endif
	
	const int64_t n = this->fStorage.NElements();
	for(int64_t i = 0L; i < n; i++) this->fStorage[i] += TVar(k)*B.fStorage[i];
	
}